

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O2

void ecs_dbg_table(ecs_world_t *world,ecs_table_t *table,ecs_dbg_table_t *dbg_out)

{
  ecs_vector_t *vector;
  uint uVar1;
  int32_t iVar2;
  void *pvVar3;
  ulong uVar4;
  ecs_type_t peVar5;
  ecs_type_t to_remove;
  ecs_data_t *peVar6;
  ecs_entity_t *peVar7;
  ulong uVar8;
  char *__assertion;
  ulong uVar9;
  ecs_dbg_entity_t parent_dbg;
  ecs_dbg_table_t parent_table_dbg;
  
  _ecs_assert(dbg_out != (ecs_dbg_table_t *)0x0,2,(char *)0x0,"dbg_out != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
              ,0x15);
  if (dbg_out == (ecs_dbg_table_t *)0x0) {
    __assertion = "dbg_out != ((void*)0)";
    uVar1 = 0x15;
  }
  else {
    uVar9 = 0;
    _ecs_assert(table != (ecs_table_t *)0x0,2,(char *)0x0,"table != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
                ,0x16);
    if (table != (ecs_table_t *)0x0) {
      dbg_out->table = table;
      dbg_out->type = (ecs_type_t)0x0;
      dbg_out->shared = (ecs_type_t)0x0;
      dbg_out->container = (ecs_type_t)0x0;
      dbg_out->parent_entities = (ecs_type_t)0x0;
      dbg_out->base_entities = (ecs_type_t)0x0;
      dbg_out->systems_matched = (ecs_vector_t *)0x0;
      dbg_out->entities = (ecs_entity_t *)0x0;
      *(undefined8 *)&dbg_out->entities_count = 0;
      vector = table->type;
      dbg_out->type = vector;
      dbg_out->systems_matched = table->queries;
      pvVar3 = _ecs_vector_first(vector,8,0x10);
      uVar1 = ecs_vector_count(table->type);
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar9;
      }
      for (; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        uVar8 = *(ulong *)((long)pvVar3 + uVar9 * 8);
        if ((uVar8 & 0xff00000000000000) == 0xfe00000000000000) {
          uVar8 = uVar8 & 0xffffffffffffff;
          ecs_dbg_entity(world,uVar8,&parent_dbg);
          ecs_dbg_table(world,parent_dbg.table,&parent_table_dbg);
          peVar5 = ecs_type_merge(world,dbg_out->shared,parent_dbg.type,(ecs_type_t)0x0);
          dbg_out->shared = peVar5;
          peVar5 = ecs_type_merge(world,peVar5,parent_table_dbg.shared,(ecs_type_t)0x0);
          dbg_out->shared = peVar5;
          peVar5 = ecs_type_merge(world,peVar5,(ecs_type_t)0x0,FLECS__TEcsName);
          dbg_out->shared = peVar5;
          to_remove = ecs_type_from_entity(world,0x101);
          peVar5 = ecs_type_merge(world,peVar5,(ecs_type_t)0x0,to_remove);
          dbg_out->shared = peVar5;
          peVar5 = ecs_type_merge(world,peVar5,(ecs_type_t)0x0,table->type);
          dbg_out->shared = peVar5;
          peVar5 = ecs_type_add(world,dbg_out->base_entities,uVar8);
          dbg_out->base_entities = peVar5;
          peVar5 = ecs_type_add(world,parent_table_dbg.base_entities,uVar8);
          dbg_out->base_entities = peVar5;
        }
        else if ((uVar8 & 0xff00000000000000) == 0xfd00000000000000) {
          ecs_dbg_entity(world,uVar8 & 0xffffffffffffff,&parent_dbg);
          ecs_dbg_table(world,parent_dbg.table,&parent_table_dbg);
          peVar5 = ecs_type_merge(world,dbg_out->container,parent_dbg.type,(ecs_type_t)0x0);
          dbg_out->container = peVar5;
          peVar5 = ecs_type_merge(world,peVar5,parent_table_dbg.shared,(ecs_type_t)0x0);
          dbg_out->container = peVar5;
          peVar5 = ecs_type_add(world,dbg_out->parent_entities,uVar8 & 0xffffffffffffff);
          dbg_out->parent_entities = peVar5;
        }
      }
      peVar6 = ecs_table_get_data(table);
      if (peVar6 != (ecs_data_t *)0x0) {
        peVar7 = (ecs_entity_t *)_ecs_vector_first(peVar6->entities,8,0x10);
        dbg_out->entities = peVar7;
        iVar2 = ecs_vector_count(peVar6->entities);
        dbg_out->entities_count = iVar2;
      }
      return;
    }
    __assertion = "table != ((void*)0)";
    uVar1 = 0x16;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/dbg.c"
                ,uVar1,"void ecs_dbg_table(ecs_world_t *, ecs_table_t *, ecs_dbg_table_t *)");
}

Assistant:

void ecs_dbg_table(
    ecs_world_t *world, 
    ecs_table_t *table, 
    ecs_dbg_table_t *dbg_out)
{
    ecs_assert(dbg_out != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(table != NULL, ECS_INVALID_PARAMETER, NULL);

    *dbg_out = (ecs_dbg_table_t){.table = table};

    dbg_out->type = table->type;
    dbg_out->systems_matched = table->queries;

    /* Determine components from parent/base entities */
    ecs_entity_t *entities = ecs_vector_first(table->type, ecs_entity_t);
    int32_t i, count = ecs_vector_count(table->type);

    for (i = 0; i < count; i ++) {
        ecs_entity_t e = entities[i];

        if (ECS_HAS_ROLE(e, CHILDOF)) {
            ecs_dbg_entity_t parent_dbg;
            ecs_dbg_entity(world, e & ECS_COMPONENT_MASK, &parent_dbg);

            ecs_dbg_table_t parent_table_dbg;
            ecs_dbg_table(world, parent_dbg.table, &parent_table_dbg);

            /* Owned and shared components are available from container */
            dbg_out->container = ecs_type_merge(
                world, dbg_out->container, parent_dbg.type, NULL);
            dbg_out->container = ecs_type_merge(
                world, dbg_out->container, parent_table_dbg.shared, NULL);

            /* Add entity to list of parent entities */
            dbg_out->parent_entities = ecs_type_add(
                world, dbg_out->parent_entities, e & ECS_COMPONENT_MASK);
        }

        if (ECS_HAS_ROLE(e, INSTANCEOF)) {
            ecs_dbg_entity_t base_dbg;
            ecs_dbg_entity(world, e & ECS_COMPONENT_MASK, &base_dbg);

            ecs_dbg_table_t base_table_dbg;
            ecs_dbg_table(world, base_dbg.table, &base_table_dbg);            

            /* Owned and shared components are available from base */
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, base_dbg.type, NULL);
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, base_table_dbg.shared, NULL);

            /* Never inherit EcsName or EcsPrefab */
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, NULL, ecs_type(EcsName));
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, NULL, ecs_type_from_entity(world, EcsPrefab));

            /* Shared components are always masked by owned components */
            dbg_out->shared = ecs_type_merge(
                world, dbg_out->shared, NULL, table->type);

            /* Add entity to list of base entities */
            dbg_out->base_entities = ecs_type_add(
                world, dbg_out->base_entities, e & ECS_COMPONENT_MASK);

            /* Add base entities of entity to list of base entities */
            dbg_out->base_entities = ecs_type_add(
                world, base_table_dbg.base_entities, e & ECS_COMPONENT_MASK);                                                       
        }
    }

    ecs_data_t *data = ecs_table_get_data(table);
    if (data) {
        dbg_out->entities = ecs_vector_first(data->entities, ecs_entity_t);
        dbg_out->entities_count = ecs_vector_count(data->entities);
    }
}